

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::texture::util::TextureRenderer::add2DTexture(TextureRenderer *this,TestTexture2DSp *texture)

{
  Context *context;
  TextureBinding *this_00;
  TestTextureSp local_38;
  SharedPtr<vkt::texture::util::TextureBinding> local_28;
  TestTexture2DSp *local_18;
  TestTexture2DSp *texture_local;
  TextureRenderer *this_local;
  
  local_18 = texture;
  texture_local = (TestTexture2DSp *)this;
  this_00 = (TextureBinding *)operator_new(0x70);
  context = this->m_context;
  de::SharedPtr::operator_cast_to_SharedPtr((SharedPtr *)&local_38);
  TextureBinding::TextureBinding(this_00,context,&local_38,TYPE_2D);
  de::SharedPtr<vkt::texture::util::TextureBinding>::SharedPtr(&local_28,this_00);
  std::
  vector<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ::push_back(&this->m_textureBindings,&local_28);
  de::SharedPtr<vkt::texture::util::TextureBinding>::~SharedPtr(&local_28);
  de::SharedPtr<vkt::pipeline::TestTexture>::~SharedPtr(&local_38);
  return;
}

Assistant:

void TextureRenderer::add2DTexture (const TestTexture2DSp& texture)
{
	m_textureBindings.push_back(TextureBindingSp(new TextureBinding(m_context, texture, TextureBinding::TYPE_2D)));
}